

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_highbd_quantize_dc_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  tran_low_t *in_RDX;
  qm_val_t *unaff_RBX;
  int unaff_EBP;
  int16_t in_SI;
  uint16_t *in_RDI;
  tran_low_t *in_R8;
  undefined8 in_R9;
  qm_val_t *unaff_R14;
  long in_stack_00000010;
  qm_val_t *iqm_ptr;
  qm_val_t *qm_ptr;
  int skip_block;
  uint in_stack_ffffffffffffffb0;
  
  highbd_quantize_dc(in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                     (int16_t *)(ulong)in_stack_ffffffffffffffb0,
                     (int16_t)((ulong)*(undefined8 *)(in_stack_00000010 + 8) >> 0x30),
                     *(tran_low_t **)(in_stack_00000010 + 0x10),in_RDX,in_SI,in_RDI,unaff_RBX,
                     unaff_R14,unaff_EBP);
  return;
}

Assistant:

void av1_highbd_quantize_dc_facade(const tran_low_t *coeff_ptr,
                                   intptr_t n_coeffs, const MACROBLOCK_PLANE *p,
                                   tran_low_t *qcoeff_ptr,
                                   tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                                   const SCAN_ORDER *sc,
                                   const QUANT_PARAM *qparam) {
  // obsolete skip_block
  const int skip_block = 0;
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
  (void)sc;

  highbd_quantize_dc(coeff_ptr, (int)n_coeffs, skip_block, p->round_QTX,
                     p->quant_fp_QTX[0], qcoeff_ptr, dqcoeff_ptr,
                     p->dequant_QTX[0], eob_ptr, qm_ptr, iqm_ptr,
                     qparam->log_scale);
}